

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O1

void Extra_UnateInfoPrint(Extra_UnateInfo_t *p)

{
  int iVar1;
  Extra_UnateVar_t EVar2;
  Extra_UnateVar_t *pEVar3;
  char *__s;
  long lVar4;
  char cVar5;
  size_t __n;
  
  __n = (size_t)p->nVarsMax;
  __s = (char *)malloc(__n + 1);
  memset(__s,0x20,__n);
  __s[__n] = '\0';
  iVar1 = p->nVars;
  if (0 < (long)iVar1) {
    pEVar3 = p->pVars;
    lVar4 = 0;
    do {
      EVar2 = pEVar3[lVar4];
      cVar5 = '.';
      if (0x3fffffff < (uint)EVar2) {
        cVar5 = 'p';
      }
      if ((int)EVar2 < 0) {
        cVar5 = 'n';
      }
      __s[(uint)EVar2 & 0x3fffffff] = cVar5;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  puts(__s);
  if (__s != (char *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Extra_UnateInfoPrint( Extra_UnateInfo_t * p )
{
    char * pBuffer;
    int i;
    pBuffer = ABC_ALLOC( char, p->nVarsMax+1 );
    memset( pBuffer, ' ', (size_t)p->nVarsMax );
    pBuffer[p->nVarsMax] = 0;
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pVars[i].Neg )
            pBuffer[ p->pVars[i].iVar ] = 'n';
        else if ( p->pVars[i].Pos )
            pBuffer[ p->pVars[i].iVar ] = 'p';
        else
            pBuffer[ p->pVars[i].iVar ] = '.';
    printf( "%s\n", pBuffer );
    ABC_FREE( pBuffer );
}